

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint uVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ImVector<stbrp_rect> pack_rects;
  ImVector<stbrp_rect> local_28;
  
  local_28.Size = 0;
  local_28.Capacity = 0;
  local_28.Data = (stbrp_rect *)0x0;
  ImVector<stbrp_rect>::resize(&local_28,(atlas->CustomRects).Size);
  lVar6 = 0;
  memset(local_28.Data,0,(long)local_28.Size << 4);
  iVar5 = (atlas->CustomRects).Size;
  for (lVar3 = 0; lVar3 < iVar5; lVar3 = lVar3 + 1) {
    *(undefined4 *)((long)&(local_28.Data)->w + lVar6) =
         *(undefined4 *)(&((atlas->CustomRects).Data)->Width + lVar6);
    lVar6 = lVar6 + 0x10;
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,local_28.Data,local_28.Size);
  uVar4 = 0;
  uVar2 = local_28._0_8_ & 0xffffffff;
  if (local_28.Size < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    if (*(int *)((long)&(local_28.Data)->was_packed + uVar4) != 0) {
      uVar1 = *(uint *)((long)&(local_28.Data)->x + uVar4);
      *(uint *)(&((atlas->CustomRects).Data)->X + uVar4) = uVar1;
      iVar5 = (uint)*(ushort *)((long)&(local_28.Data)->h + uVar4) + (uVar1 >> 0x10);
      if (iVar5 < atlas->TexHeight) {
        iVar5 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar5;
    }
  }
  ImVector<stbrp_rect>::~ImVector(&local_28);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}